

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspm.cpp
# Opt level: O3

bool __thiscall pg::MSPMSolver::lift(MSPMSolver *this,int node,int target)

{
  int *pm;
  int d;
  int iVar1;
  Game *pGVar2;
  ulong uVar3;
  int *piVar4;
  int *piVar5;
  char cVar6;
  bool bVar7;
  ulong uVar8;
  ostream *poVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  uint pl;
  uint uVar15;
  int to;
  uint uVar16;
  int *piVar17;
  int to_1;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  uint local_88;
  uint local_84;
  
  uVar13 = (ulong)node;
  pm = this->pms + (long)this->k * uVar13;
  if ((*pm == -1) && (pm[1] == -1)) {
    return false;
  }
  this->lift_attempt = this->lift_attempt + 1;
  uVar19 = uVar13 >> 6;
  pGVar2 = (this->super_Solver).game;
  uVar3 = (pGVar2->_owner)._bits[uVar19];
  d = pGVar2->_priority[uVar13];
  uVar8 = 1L << (uVar13 & 0x3f);
  bVar21 = (uVar3 & uVar8) == 0;
  bVar7 = !bVar21;
  pl = (uint)bVar21;
  if (1 < (this->super_Solver).trace) {
    poVar9 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1mupdating node ",0x12);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,node);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"/",1);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,d);
    pcVar14 = " (odd)";
    bVar21 = ((((this->super_Solver).game)->_owner)._bits[uVar19] & uVar8) == 0;
    if (bVar21) {
      pcVar14 = " (even)";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar14,(ulong)bVar21 | 6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\x1b[m with current progress measure",0x21);
    pm_stream(this,(this->super_Solver).logger,pm);
    poVar9 = (this->super_Solver).logger;
    cVar6 = (char)poVar9;
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar6);
    std::ostream::put(cVar6);
    std::ostream::flush();
  }
  uVar15 = (uint)bVar7;
  uVar20 = (ulong)((uVar3 & uVar8) != 0);
  uVar11 = (ulong)pl;
  if (pm[uVar20] == -1) {
    local_84 = 0xffffffff;
    local_88 = 0xffffffff;
LAB_00162dd8:
    uVar16 = local_84;
    if ((pm[uVar11] == -1) || ((target != -1 && (this->strategy[uVar13] != target))))
    goto LAB_0016308a;
  }
  else {
    if (1 < (this->super_Solver).trace) {
      poVar9 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"computing max",0xd);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      if ((1 < (this->super_Solver).trace) && ((int)pl < this->k)) {
        piVar17 = this->tmp;
        uVar10 = uVar11;
        do {
          piVar17[uVar10] = pm[uVar10];
          uVar10 = uVar10 + 2;
        } while ((long)uVar10 < (long)this->k);
      }
    }
    if (target != -1) {
      local_84 = 0xffffffff;
      Prog(this,this->tmp,this->pms + (long)this->k * (long)target,d,(uint)bVar7);
      if (1 < (this->super_Solver).trace) {
        poVar9 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"successor node ",0xf);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,target);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"/",1);
        poVar9 = (ostream *)
                 std::ostream::operator<<(poVar9,((this->super_Solver).game)->_priority[target]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," results in",0xb);
        pm_stream(this,(this->super_Solver).logger,this->tmp);
        poVar9 = (this->super_Solver).logger;
        cVar6 = (char)poVar9;
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
      }
      piVar17 = this->tmp;
      bVar7 = pm_less(this,pm,piVar17,d,uVar15);
      local_88 = 0xffffffff;
      if (bVar7) {
        uVar10 = uVar20;
        if ((int)uVar15 < this->k) {
          do {
            pm[uVar10] = piVar17[uVar10];
            uVar10 = uVar10 + 2;
          } while ((long)uVar10 < (long)this->k);
        }
        local_84 = -(uint)((uVar3 & uVar8) == 0) | target;
        local_88 = -(uint)((uVar3 & uVar8) != 0) | target;
      }
      goto LAB_00162dd8;
    }
    pGVar2 = (this->super_Solver).game;
    piVar17 = pGVar2->_outedges;
    iVar1 = pGVar2->_firstouts[uVar13];
    uVar16 = piVar17[iVar1];
    if (uVar16 != 0xffffffff) {
      piVar17 = piVar17 + iVar1;
      local_88 = 0xffffffff;
      local_84 = 0xffffffff;
      do {
        lVar12 = (long)(int)uVar16;
        uVar18 = local_84;
        if (this->cover[lVar12] != -2) {
          Prog(this,this->tmp,this->pms + this->k * lVar12,d,(uint)bVar7);
          if (1 < (this->super_Solver).trace) {
            poVar9 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"successor node ",0xf);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"/",1);
            poVar9 = (ostream *)
                     std::ostream::operator<<(poVar9,((this->super_Solver).game)->_priority[lVar12])
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," results in",0xb);
            pm_stream(this,(this->super_Solver).logger,this->tmp);
            poVar9 = (this->super_Solver).logger;
            cVar6 = (char)poVar9;
            std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar6);
            std::ostream::put(cVar6);
            std::ostream::flush();
          }
          piVar4 = this->tmp;
          bVar21 = pm_less(this,pm,piVar4,d,uVar15);
          if (bVar21) {
            uVar10 = uVar20;
            if ((int)uVar15 < this->k) {
              do {
                pm[uVar10] = piVar4[uVar10];
                uVar10 = uVar10 + 2;
              } while ((long)uVar10 < (long)this->k);
            }
            uVar18 = uVar16;
            if ((uVar8 & uVar3) == 0) {
              local_88 = uVar16;
              uVar18 = local_84;
            }
          }
        }
        local_84 = uVar18;
        uVar16 = piVar17[1];
        piVar17 = piVar17 + 1;
      } while (uVar16 != 0xffffffff);
      goto LAB_00162dd8;
    }
    local_84 = 0xffffffff;
    local_88 = 0xffffffff;
    uVar16 = local_84;
    if (pm[uVar11] == -1) goto LAB_0016308a;
  }
  if (1 < (this->super_Solver).trace) {
    poVar9 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"computing min",0xd);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if ((1 < (this->super_Solver).trace) && ((int)uVar15 < this->k)) {
      piVar17 = this->tmp;
      do {
        piVar17[uVar20] = pm[uVar20];
        uVar20 = uVar20 + 2;
      } while ((long)uVar20 < (long)this->k);
    }
  }
  pGVar2 = (this->super_Solver).game;
  piVar17 = pGVar2->_outedges;
  iVar1 = pGVar2->_firstouts[uVar13];
  uVar15 = piVar17[iVar1];
  if (uVar15 == 0xffffffff) {
    uVar18 = 0xffffffff;
  }
  else {
    piVar17 = piVar17 + iVar1;
    uVar18 = 0xffffffff;
    do {
      lVar12 = (long)(int)uVar15;
      if (this->cover[lVar12] != -2) {
        Prog(this,this->tmp,this->pms + this->k * lVar12,d,pl);
        if (1 < (this->super_Solver).trace) {
          poVar9 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"successor node ",0xf);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"/",1);
          poVar9 = (ostream *)
                   std::ostream::operator<<(poVar9,((this->super_Solver).game)->_priority[lVar12]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," results in",0xb);
          pm_stream(this,(this->super_Solver).logger,this->tmp);
          poVar9 = (this->super_Solver).logger;
          cVar6 = (char)poVar9;
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
        }
        if (((uVar18 == 0xffffffff) || (bVar7 = pm_less(this,this->tmp,this->best,d,pl), bVar7)) &&
           (uVar18 = uVar15, 0 < this->k)) {
          piVar4 = this->tmp;
          piVar5 = this->best;
          lVar12 = 0;
          do {
            piVar5[lVar12] = piVar4[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar12 < this->k);
        }
      }
      uVar15 = piVar17[1];
      piVar17 = piVar17 + 1;
    } while (uVar15 != 0xffffffff);
  }
  this->strategy[uVar13] = uVar18;
  piVar17 = this->best;
  bVar7 = pm_less(this,pm,piVar17,d,pl);
  uVar16 = local_84;
  if (bVar7) {
    if ((int)pl < this->k) {
      do {
        pm[uVar11] = piVar17[uVar11];
        uVar11 = uVar11 + 2;
      } while ((long)uVar11 < (long)this->k);
    }
    uVar16 = uVar18;
    if ((uVar8 & uVar3) != 0) {
      local_88 = uVar18;
      uVar16 = local_84;
    }
  }
LAB_0016308a:
  local_84 = uVar16;
  if ((local_88 == 0xffffffff) && (local_84 == 0xffffffff)) {
    return false;
  }
  if ((this->super_Solver).trace != 0) {
    poVar9 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;32mupdated node ",0x14);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,node);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"/",1);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,d);
    bVar7 = ((((this->super_Solver).game)->_owner)._bits[uVar19] & uVar8) == 0;
    pcVar14 = " (odd)";
    if (bVar7) {
      pcVar14 = " (even)";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar14,(ulong)bVar7 | 6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m to",6);
    pm_stream(this,(this->super_Solver).logger,pm);
    poVar9 = (this->super_Solver).logger;
    cVar6 = (char)poVar9;
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar6);
    std::ostream::put(cVar6);
    std::ostream::flush();
  }
  if ((local_88 != 0xffffffff) && (*pm == -1)) {
    solve(this,node,local_88);
  }
  if ((local_84 != 0xffffffff) && (pm[1] == -1)) {
    solve(this,node,local_84);
  }
  this->lift_count = this->lift_count + 1;
  return true;
}

Assistant:

bool
MSPMSolver::lift(int node, int target)
{
    // obtain ptr to current progress measure
    int *pm = pms + k*node;

    // check if already Top for both players
    if (pm[0] == -1 and pm[1] == -1) return false;

    lift_attempt++;

    // initialize stuff
    const int pl_max = owner(node);
    const int pl_min = 1 - pl_max;
    const int d = priority(node);

    if (trace >= 2) {
        logger << "\033[1mupdating node " << node << "/" << d << (owner(node)?" (odd)":" (even)") << "\033[m with current progress measure";
        pm_stream(logger, pm);
        logger << std::endl;
    }

    int best_ch0 = -1, best_ch1 = -1;

    // do max for player <pl_max>
    if (pm[pl_max] != -1) {
        if (trace >= 2) logger << "computing max" << std::endl;
        if (trace >= 2) pm_copy(tmp, pm, 1-pl_max);

        if (target != -1) {
            // just look at target
            Prog(tmp, pms + k*target, d, pl_max);

            if (trace >= 2) {
                logger << "successor node " << target << "/" << priority(target) << " results in";
                pm_stream(logger, tmp);
                logger << std::endl;
            }

            if (pm_less(pm, tmp, d, pl_max)) {
                pm_copy(pm, tmp, pl_max);
                if (pl_max) best_ch1 = target;
                else best_ch0 = target;
            }
        } else {
            for (auto curedge = outs(node); *curedge != -1; curedge++) {
                int to = *curedge;
                if (cover[to] == -2) continue;
                Prog(tmp, pms + k*to, d, pl_max);

                if (trace >= 2) {
                    logger << "successor node " << to << "/" << priority(to) << " results in";
                    pm_stream(logger, tmp);
                    logger << std::endl;
                }

                if (pm_less(pm, tmp, d, pl_max)) {
                    pm_copy(pm, tmp, pl_max);
                    if (pl_max) best_ch1 = to;
                    else best_ch0 = to;
                }
            }
        }
    }

    // do min for player <pl_min>
    if (pm[pl_min] != -1 and (target == -1 or target == strategy[node])) {
        if (trace >= 2) logger << "computing min" << std::endl;
        if (trace >= 2) pm_copy(tmp, pm, 1-pl_min);
        int best_to = -1;
        for (auto curedge = outs(node); *curedge != -1; curedge++) {
            int to = *curedge;
            if (cover[to] == -2) continue;
            Prog(tmp, pms + k*to, d, pl_min);

            if (trace >= 2) {
                logger << "successor node " << to << "/" << priority(to) << " results in";
                pm_stream(logger, tmp);
                logger << std::endl;
            }

            if (best_to == -1 or pm_less(tmp, best, d, pl_min)) {
                for (int i=0; i<k; i++) best[i] = tmp[i];
                best_to = to;
            }
        }

        strategy[node] = best_to;
        // note: sometimes only the strategy changes, but the lowest pm stays the same
        // now "best" contains the smallest Prog, which may be higher than the current min
        if (pm_less(pm, best, d, pl_min)) {
            pm_copy(pm, best, pl_min);
            if (pl_min) best_ch1 = best_to;
            else best_ch0 = best_to;
        }
    }

    bool ch0 = best_ch0 != -1;
    bool ch1 = best_ch1 != -1;

    if (ch0 or ch1) {
        if (trace) {
            logger << "\033[1;32mupdated node " << node << "/" << d << (owner(node)?" (odd)":" (even)") << "\033[m to";
            pm_stream(logger, pm);
            logger << std::endl;
        }
        // check if a changed pm is now Top
        if (ch0 and pm[0] == -1) solve(node, best_ch0);
        if (ch1 and pm[1] == -1) solve(node, best_ch1);
        // increase count and return true
        lift_count++;
        return true;
    } else {
        return false;
    }
}